

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftPvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  undefined4 *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  Real RVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  long lVar10;
  long lVar11;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  undefined4 *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  undefined4 *puVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_6b8;
  uint auStack_6b0 [25];
  undefined3 uStack_64b;
  int iStack_648;
  bool bStack_644;
  undefined8 local_640;
  cpp_dec_float<200U,_int,_void> local_638;
  cpp_dec_float<200U,_int,_void> local_5b8;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar21 = 0;
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_3b8,this);
  local_640._0_4_ = cpp_dec_float_finite;
  local_640._4_4_ = 0x1c;
  local_6b8.info = 0;
  local_6b8.idx = 0;
  auStack_6b0[0] = 0;
  auStack_6b0[1] = 0;
  auStack_6b0[2] = 0;
  auStack_6b0[3] = 0;
  auStack_6b0[4] = 0;
  auStack_6b0[5] = 0;
  auStack_6b0[6] = 0;
  auStack_6b0[7] = 0;
  auStack_6b0[8] = 0;
  auStack_6b0[9] = 0;
  auStack_6b0[10] = 0;
  auStack_6b0[0xb] = 0;
  auStack_6b0[0xc] = 0;
  auStack_6b0[0xd] = 0;
  auStack_6b0[0xe] = 0;
  auStack_6b0[0xf] = 0;
  auStack_6b0[0x10] = 0;
  auStack_6b0[0x11] = 0;
  auStack_6b0[0x12] = 0;
  auStack_6b0[0x13] = 0;
  auStack_6b0[0x14] = 0;
  auStack_6b0[0x15] = 0;
  auStack_6b0[0x16] = 0;
  auStack_6b0[0x17] = 0;
  stack0xfffffffffffff9b0 = 0;
  uStack_64b = 0;
  iStack_648 = 0;
  bStack_644 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_6b8,10.0);
  pcVar13 = &local_3b8;
  pcVar16 = &local_338;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar16->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
  }
  local_338.exp = local_3b8.exp;
  local_338.neg = local_3b8.neg;
  local_338.fpclass = local_3b8.fpclass;
  local_338.prec_elem = local_3b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_338,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_438,this);
  local_640._0_4_ = cpp_dec_float_finite;
  local_640._4_4_ = 0x1c;
  local_6b8.info = 0;
  local_6b8.idx = 0;
  auStack_6b0[0] = 0;
  auStack_6b0[1] = 0;
  auStack_6b0[2] = 0;
  auStack_6b0[3] = 0;
  auStack_6b0[4] = 0;
  auStack_6b0[5] = 0;
  auStack_6b0[6] = 0;
  auStack_6b0[7] = 0;
  auStack_6b0[8] = 0;
  auStack_6b0[9] = 0;
  auStack_6b0[10] = 0;
  auStack_6b0[0xb] = 0;
  auStack_6b0[0xc] = 0;
  auStack_6b0[0xd] = 0;
  auStack_6b0[0xe] = 0;
  auStack_6b0[0xf] = 0;
  auStack_6b0[0x10] = 0;
  auStack_6b0[0x11] = 0;
  auStack_6b0[0x12] = 0;
  auStack_6b0[0x13] = 0;
  auStack_6b0[0x14] = 0;
  auStack_6b0[0x15] = 0;
  auStack_6b0[0x16] = 0;
  auStack_6b0[0x17] = 0;
  stack0xfffffffffffff9b0 = 0;
  uStack_64b = 0;
  iStack_648 = 0;
  bStack_644 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_6b8,100.0);
  pcVar13 = &local_438;
  pcVar16 = &local_3b8;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar16->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar21 * -2 + 1) * 4);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
  }
  local_3b8.exp = local_438.exp;
  local_3b8.neg = local_438.neg;
  local_3b8.fpclass = local_438.fpclass;
  local_3b8.prec_elem = local_438.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_3b8,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_6b8,this);
  RVar4 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,RVar4);
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)&local_6b8;
  pcVar16 = &local_438;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
  }
  local_438.exp = iStack_648;
  local_438.neg = bStack_644;
  local_438.fpclass = (fpclass_type)local_640;
  local_438.prec_elem = local_640._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_438,&local_b8);
  uVar20 = (ulong)(this->thecovectors->set).thenum;
  if (0 < (long)uVar20) {
    lVar10 = uVar20 << 7;
    do {
      iVar19 = (int)(uVar20 - 1);
      local_6b8 = (DataKey)coId(this,iVar19);
      bVar7 = isBasic(this,(SPxId *)&local_6b8);
      pnVar2 = (this->theCoUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar10);
      local_640._0_4_ = cpp_dec_float_finite;
      local_640._4_4_ = 0x1c;
      local_6b8.info = 0;
      local_6b8.idx = 0;
      auStack_6b0[0] = 0;
      auStack_6b0[1] = 0;
      auStack_6b0[2] = 0;
      auStack_6b0[3] = 0;
      auStack_6b0[4] = 0;
      auStack_6b0[5] = 0;
      auStack_6b0[6] = 0;
      auStack_6b0[7] = 0;
      auStack_6b0[8] = 0;
      auStack_6b0[9] = 0;
      auStack_6b0[10] = 0;
      auStack_6b0[0xb] = 0;
      auStack_6b0[0xc] = 0;
      auStack_6b0[0xd] = 0;
      auStack_6b0[0xe] = 0;
      auStack_6b0[0xf] = 0;
      auStack_6b0[0x10] = 0;
      auStack_6b0[0x11] = 0;
      auStack_6b0[0x12] = 0;
      auStack_6b0[0x13] = 0;
      auStack_6b0[0x14] = 0;
      auStack_6b0[0x15] = 0;
      auStack_6b0[0x16] = 0;
      auStack_6b0[0x17] = 0;
      stack0xfffffffffffff9b0 = 0;
      uStack_64b = 0;
      iStack_648 = 0;
      bStack_644 = false;
      if (pcVar13 != (cpp_dec_float<200U,_int,_void> *)&local_6b8) {
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&local_6b8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
        }
        iStack_648 = *(int *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
        bStack_644 = *(bool *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
        local_640 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)&local_6b8,&local_438);
      if ((((fpclass_type)local_640 == cpp_dec_float_NaN) ||
          (pnVar2 = (this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          *(int *)((long)&pnVar2->m_backend + lVar10 + -8) == 2)) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&local_6b8,
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar2 + 0xffffffffffffffff) + lVar10)), 0 < iVar8 || bVar7)) {
        pnVar2 = (this->theCoLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar10);
        local_640._0_4_ = cpp_dec_float_finite;
        local_640._4_4_ = 0x1c;
        local_6b8.info = 0;
        local_6b8.idx = 0;
        auStack_6b0[0] = 0;
        auStack_6b0[1] = 0;
        auStack_6b0[2] = 0;
        auStack_6b0[3] = 0;
        auStack_6b0[4] = 0;
        auStack_6b0[5] = 0;
        auStack_6b0[6] = 0;
        auStack_6b0[7] = 0;
        auStack_6b0[8] = 0;
        auStack_6b0[9] = 0;
        auStack_6b0[10] = 0;
        auStack_6b0[0xb] = 0;
        auStack_6b0[0xc] = 0;
        auStack_6b0[0xd] = 0;
        auStack_6b0[0xe] = 0;
        auStack_6b0[0xf] = 0;
        auStack_6b0[0x10] = 0;
        auStack_6b0[0x11] = 0;
        auStack_6b0[0x12] = 0;
        auStack_6b0[0x13] = 0;
        auStack_6b0[0x14] = 0;
        auStack_6b0[0x15] = 0;
        auStack_6b0[0x16] = 0;
        auStack_6b0[0x17] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        iStack_648 = 0;
        bStack_644 = false;
        if (pcVar13 != (cpp_dec_float<200U,_int,_void> *)&local_6b8) {
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)&local_6b8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
          }
          iStack_648 = *(int *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
          bStack_644 = *(bool *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
          local_640 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_6b8,&local_438);
        if ((((fpclass_type)local_640 != cpp_dec_float_NaN) &&
            (pnVar2 = (this->theCoPvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&pnVar2->m_backend + lVar10 + -8) != 2)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)&local_6b8,
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar2 + 0xffffffffffffffff) + lVar10)), !bVar7 && -1 < iVar8
           )) {
          pnVar2 = (this->theCoUbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&(pnVar2->m_backend).data + lVar10 + -8) != 2) &&
              (pnVar3 = (this->theCoLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8) != 2)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar2[-1].m_backend.data + lVar10),
                                 (cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar3[-1].m_backend.data + lVar10)), iVar8 == 0)) {
            pnVar2 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar14 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pnVar17 = &local_1b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = *puVar14;
              puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_1b8.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_1b8.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_1b8.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
            shiftLCbound(this,iVar19,&local_1b8);
            pVVar12 = this->theCoUbound;
            pVVar9 = this->theCoLbound;
            goto LAB_0051a22c;
          }
          pnVar2 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_3b8);
          RVar4 = Random::next_random(&this->random);
          local_538.fpclass = cpp_dec_float_finite;
          local_538.prec_elem = 0x1c;
          local_538.data._M_elems[0] = 0;
          local_538.data._M_elems[1] = 0;
          local_538.data._M_elems[2] = 0;
          local_538.data._M_elems[3] = 0;
          local_538.data._M_elems[4] = 0;
          local_538.data._M_elems[5] = 0;
          local_538.data._M_elems[6] = 0;
          local_538.data._M_elems[7] = 0;
          local_538.data._M_elems[8] = 0;
          local_538.data._M_elems[9] = 0;
          local_538.data._M_elems[10] = 0;
          local_538.data._M_elems[0xb] = 0;
          local_538.data._M_elems[0xc] = 0;
          local_538.data._M_elems[0xd] = 0;
          local_538.data._M_elems[0xe] = 0;
          local_538.data._M_elems[0xf] = 0;
          local_538.data._M_elems[0x10] = 0;
          local_538.data._M_elems[0x11] = 0;
          local_538.data._M_elems[0x12] = 0;
          local_538.data._M_elems[0x13] = 0;
          local_538.data._M_elems[0x14] = 0;
          local_538.data._M_elems[0x15] = 0;
          local_538.data._M_elems[0x16] = 0;
          local_538.data._M_elems[0x17] = 0;
          local_538.data._M_elems[0x18] = 0;
          local_538.data._M_elems[0x19] = 0;
          local_538.data._M_elems._104_5_ = 0;
          local_538.data._M_elems[0x1b]._1_3_ = 0;
          local_538.exp = 0;
          local_538.neg = false;
          local_640._0_4_ = cpp_dec_float_finite;
          local_640._4_4_ = 0x1c;
          local_6b8.info = 0;
          local_6b8.idx = 0;
          auStack_6b0[0] = 0;
          auStack_6b0[1] = 0;
          auStack_6b0[2] = 0;
          auStack_6b0[3] = 0;
          auStack_6b0[4] = 0;
          auStack_6b0[5] = 0;
          auStack_6b0[6] = 0;
          auStack_6b0[7] = 0;
          auStack_6b0[8] = 0;
          auStack_6b0[9] = 0;
          auStack_6b0[10] = 0;
          auStack_6b0[0xb] = 0;
          auStack_6b0[0xc] = 0;
          auStack_6b0[0xd] = 0;
          auStack_6b0[0xe] = 0;
          auStack_6b0[0xf] = 0;
          auStack_6b0[0x10] = 0;
          auStack_6b0[0x11] = 0;
          auStack_6b0[0x12] = 0;
          auStack_6b0[0x13] = 0;
          auStack_6b0[0x14] = 0;
          auStack_6b0[0x15] = 0;
          auStack_6b0[0x16] = 0;
          auStack_6b0[0x17] = 0;
          stack0xfffffffffffff9b0 = 0;
          uStack_64b = 0;
          iStack_648 = 0;
          bStack_644 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6b8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10) !=
              &local_538) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pcVar16 = &local_538;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
            }
            local_538.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_538.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_538._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_538,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
          shiftLCbound(this,iVar19,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_538);
        }
      }
      else {
        pnVar2 = (this->theCoUbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&(pnVar2->m_backend).data + lVar10 + -8) == 2) ||
            (pnVar3 = (this->theCoLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8) == 2)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar2[-1].m_backend.data + lVar10),
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar3[-1].m_backend.data + lVar10)), iVar8 != 0)) {
          pnVar2 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_3b8);
          RVar4 = Random::next_random(&this->random);
          local_4b8.fpclass = cpp_dec_float_finite;
          local_4b8.prec_elem = 0x1c;
          local_4b8.data._M_elems[0] = 0;
          local_4b8.data._M_elems[1] = 0;
          local_4b8.data._M_elems[2] = 0;
          local_4b8.data._M_elems[3] = 0;
          local_4b8.data._M_elems[4] = 0;
          local_4b8.data._M_elems[5] = 0;
          local_4b8.data._M_elems[6] = 0;
          local_4b8.data._M_elems[7] = 0;
          local_4b8.data._M_elems[8] = 0;
          local_4b8.data._M_elems[9] = 0;
          local_4b8.data._M_elems[10] = 0;
          local_4b8.data._M_elems[0xb] = 0;
          local_4b8.data._M_elems[0xc] = 0;
          local_4b8.data._M_elems[0xd] = 0;
          local_4b8.data._M_elems[0xe] = 0;
          local_4b8.data._M_elems[0xf] = 0;
          local_4b8.data._M_elems[0x10] = 0;
          local_4b8.data._M_elems[0x11] = 0;
          local_4b8.data._M_elems[0x12] = 0;
          local_4b8.data._M_elems[0x13] = 0;
          local_4b8.data._M_elems[0x14] = 0;
          local_4b8.data._M_elems[0x15] = 0;
          local_4b8.data._M_elems[0x16] = 0;
          local_4b8.data._M_elems[0x17] = 0;
          local_4b8.data._M_elems[0x18] = 0;
          local_4b8.data._M_elems[0x19] = 0;
          local_4b8.data._M_elems._104_5_ = 0;
          local_4b8.data._M_elems[0x1b]._1_3_ = 0;
          local_4b8.exp = 0;
          local_4b8.neg = false;
          local_640._0_4_ = cpp_dec_float_finite;
          local_640._4_4_ = 0x1c;
          local_6b8.info = 0;
          local_6b8.idx = 0;
          auStack_6b0[0] = 0;
          auStack_6b0[1] = 0;
          auStack_6b0[2] = 0;
          auStack_6b0[3] = 0;
          auStack_6b0[4] = 0;
          auStack_6b0[5] = 0;
          auStack_6b0[6] = 0;
          auStack_6b0[7] = 0;
          auStack_6b0[8] = 0;
          auStack_6b0[9] = 0;
          auStack_6b0[10] = 0;
          auStack_6b0[0xb] = 0;
          auStack_6b0[0xc] = 0;
          auStack_6b0[0xd] = 0;
          auStack_6b0[0xe] = 0;
          auStack_6b0[0xf] = 0;
          auStack_6b0[0x10] = 0;
          auStack_6b0[0x11] = 0;
          auStack_6b0[0x12] = 0;
          auStack_6b0[0x13] = 0;
          auStack_6b0[0x14] = 0;
          auStack_6b0[0x15] = 0;
          auStack_6b0[0x16] = 0;
          auStack_6b0[0x17] = 0;
          stack0xfffffffffffff9b0 = 0;
          uStack_64b = 0;
          iStack_648 = 0;
          bStack_644 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6b8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10) !=
              &local_4b8) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pcVar16 = &local_4b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
            }
            local_4b8.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_4b8.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_4b8._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_4b8,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
          shiftUCbound(this,iVar19,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_4b8);
        }
        else {
          pnVar2 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar14 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
          pnVar17 = &local_138;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_138.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
          local_138.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
          local_138.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          shiftUCbound(this,iVar19,&local_138);
          pVVar9 = this->theCoUbound;
          pVVar12 = this->theCoLbound;
LAB_0051a22c:
          pnVar2 = (pVVar9->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined4 *)
                   ((long)&(pVVar12->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10);
          puVar15 = (undefined4 *)((long)&pnVar2[-1].m_backend.data + lVar10);
          puVar18 = puVar1;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar18 = *puVar15;
            puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
          }
          puVar1[0x1c] = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
          *(undefined1 *)(puVar1 + 0x1d) =
               *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
          *(undefined8 *)(puVar1 + 0x1e) =
               *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
        }
      }
      lVar10 = lVar10 + -0x80;
      bVar7 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar7);
  }
  uVar20 = (ulong)(this->thevectors->set).thenum;
  if (0 < (long)uVar20) {
    lVar10 = uVar20 << 7;
    do {
      iVar19 = (int)(uVar20 - 1);
      local_6b8 = (DataKey)id(this,iVar19);
      bVar7 = isBasic(this,(SPxId *)&local_6b8);
      pnVar2 = (this->theUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar10);
      local_640._0_4_ = cpp_dec_float_finite;
      local_640._4_4_ = 0x1c;
      local_6b8.info = 0;
      local_6b8.idx = 0;
      auStack_6b0[0] = 0;
      auStack_6b0[1] = 0;
      auStack_6b0[2] = 0;
      auStack_6b0[3] = 0;
      auStack_6b0[4] = 0;
      auStack_6b0[5] = 0;
      auStack_6b0[6] = 0;
      auStack_6b0[7] = 0;
      auStack_6b0[8] = 0;
      auStack_6b0[9] = 0;
      auStack_6b0[10] = 0;
      auStack_6b0[0xb] = 0;
      auStack_6b0[0xc] = 0;
      auStack_6b0[0xd] = 0;
      auStack_6b0[0xe] = 0;
      auStack_6b0[0xf] = 0;
      auStack_6b0[0x10] = 0;
      auStack_6b0[0x11] = 0;
      auStack_6b0[0x12] = 0;
      auStack_6b0[0x13] = 0;
      auStack_6b0[0x14] = 0;
      auStack_6b0[0x15] = 0;
      auStack_6b0[0x16] = 0;
      auStack_6b0[0x17] = 0;
      stack0xfffffffffffff9b0 = 0;
      uStack_64b = 0;
      iStack_648 = 0;
      bStack_644 = false;
      if (pcVar13 != (cpp_dec_float<200U,_int,_void> *)&local_6b8) {
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&local_6b8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
        }
        iStack_648 = *(int *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
        bStack_644 = *(bool *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
        local_640 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)&local_6b8,&local_438);
      if ((((fpclass_type)local_640 == cpp_dec_float_NaN) ||
          (pnVar2 = (this->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          *(int *)((long)&pnVar2->m_backend + lVar10 + -8) == 2)) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&local_6b8,
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar2 + 0xffffffffffffffff) + lVar10)), 0 < iVar8 || bVar7)) {
        pnVar2 = (this->theLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar10);
        local_640._0_4_ = cpp_dec_float_finite;
        local_640._4_4_ = 0x1c;
        local_6b8.info = 0;
        local_6b8.idx = 0;
        auStack_6b0[0] = 0;
        auStack_6b0[1] = 0;
        auStack_6b0[2] = 0;
        auStack_6b0[3] = 0;
        auStack_6b0[4] = 0;
        auStack_6b0[5] = 0;
        auStack_6b0[6] = 0;
        auStack_6b0[7] = 0;
        auStack_6b0[8] = 0;
        auStack_6b0[9] = 0;
        auStack_6b0[10] = 0;
        auStack_6b0[0xb] = 0;
        auStack_6b0[0xc] = 0;
        auStack_6b0[0xd] = 0;
        auStack_6b0[0xe] = 0;
        auStack_6b0[0xf] = 0;
        auStack_6b0[0x10] = 0;
        auStack_6b0[0x11] = 0;
        auStack_6b0[0x12] = 0;
        auStack_6b0[0x13] = 0;
        auStack_6b0[0x14] = 0;
        auStack_6b0[0x15] = 0;
        auStack_6b0[0x16] = 0;
        auStack_6b0[0x17] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        iStack_648 = 0;
        bStack_644 = false;
        if (pcVar13 != (cpp_dec_float<200U,_int,_void> *)&local_6b8) {
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)&local_6b8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
          }
          iStack_648 = *(int *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
          bStack_644 = *(bool *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
          local_640 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_6b8,&local_438);
        if ((((fpclass_type)local_640 != cpp_dec_float_NaN) &&
            (pnVar2 = (this->thePvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&pnVar2->m_backend + lVar10 + -8) != 2)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)&local_6b8,
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar2 + 0xffffffffffffffff) + lVar10)), !bVar7 && -1 < iVar8
           )) {
          pnVar2 = (this->theUbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&(pnVar2->m_backend).data + lVar10 + -8) != 2) &&
              (pnVar3 = (this->theLbound->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8) != 2)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar2[-1].m_backend.data + lVar10),
                                 (cpp_dec_float<200U,_int,_void> *)
                                 ((long)&pnVar3[-1].m_backend.data + lVar10)), iVar8 == 0)) {
            pnVar2 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar14 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pnVar17 = &local_2b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = *puVar14;
              puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_2b8.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_2b8.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_2b8.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
            shiftLPbound(this,iVar19,&local_2b8);
            pVVar12 = this->theUbound;
            pVVar9 = this->theLbound;
            goto LAB_0051a878;
          }
          pnVar2 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_3b8);
          RVar4 = Random::next_random(&this->random);
          local_638.fpclass = cpp_dec_float_finite;
          local_638.prec_elem = 0x1c;
          local_638.data._M_elems[0] = 0;
          local_638.data._M_elems[1] = 0;
          local_638.data._M_elems[2] = 0;
          local_638.data._M_elems[3] = 0;
          local_638.data._M_elems[4] = 0;
          local_638.data._M_elems[5] = 0;
          local_638.data._M_elems[6] = 0;
          local_638.data._M_elems[7] = 0;
          local_638.data._M_elems[8] = 0;
          local_638.data._M_elems[9] = 0;
          local_638.data._M_elems[10] = 0;
          local_638.data._M_elems[0xb] = 0;
          local_638.data._M_elems[0xc] = 0;
          local_638.data._M_elems[0xd] = 0;
          local_638.data._M_elems[0xe] = 0;
          local_638.data._M_elems[0xf] = 0;
          local_638.data._M_elems[0x10] = 0;
          local_638.data._M_elems[0x11] = 0;
          local_638.data._M_elems[0x12] = 0;
          local_638.data._M_elems[0x13] = 0;
          local_638.data._M_elems[0x14] = 0;
          local_638.data._M_elems[0x15] = 0;
          local_638.data._M_elems[0x16] = 0;
          local_638.data._M_elems[0x17] = 0;
          local_638.data._M_elems[0x18] = 0;
          local_638.data._M_elems[0x19] = 0;
          local_638.data._M_elems._104_5_ = 0;
          local_638.data._M_elems[0x1b]._1_3_ = 0;
          local_638.exp = 0;
          local_638.neg = false;
          local_640._0_4_ = cpp_dec_float_finite;
          local_640._4_4_ = 0x1c;
          local_6b8.info = 0;
          local_6b8.idx = 0;
          auStack_6b0[0] = 0;
          auStack_6b0[1] = 0;
          auStack_6b0[2] = 0;
          auStack_6b0[3] = 0;
          auStack_6b0[4] = 0;
          auStack_6b0[5] = 0;
          auStack_6b0[6] = 0;
          auStack_6b0[7] = 0;
          auStack_6b0[8] = 0;
          auStack_6b0[9] = 0;
          auStack_6b0[10] = 0;
          auStack_6b0[0xb] = 0;
          auStack_6b0[0xc] = 0;
          auStack_6b0[0xd] = 0;
          auStack_6b0[0xe] = 0;
          auStack_6b0[0xf] = 0;
          auStack_6b0[0x10] = 0;
          auStack_6b0[0x11] = 0;
          auStack_6b0[0x12] = 0;
          auStack_6b0[0x13] = 0;
          auStack_6b0[0x14] = 0;
          auStack_6b0[0x15] = 0;
          auStack_6b0[0x16] = 0;
          auStack_6b0[0x17] = 0;
          stack0xfffffffffffff9b0 = 0;
          uStack_64b = 0;
          iStack_648 = 0;
          bStack_644 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6b8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10) !=
              &local_638) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pcVar16 = &local_638;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
            }
            local_638.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_638.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_638._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_638,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
          shiftLPbound(this,iVar19,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_638);
        }
      }
      else {
        pnVar2 = (this->theUbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&(pnVar2->m_backend).data + lVar10 + -8) == 2) ||
            (pnVar3 = (this->theLbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8) == 2)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar2[-1].m_backend.data + lVar10),
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar3[-1].m_backend.data + lVar10)), iVar8 != 0)) {
          pnVar2 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_3b8);
          RVar4 = Random::next_random(&this->random);
          local_5b8.fpclass = cpp_dec_float_finite;
          local_5b8.prec_elem = 0x1c;
          local_5b8.data._M_elems[0] = 0;
          local_5b8.data._M_elems[1] = 0;
          local_5b8.data._M_elems[2] = 0;
          local_5b8.data._M_elems[3] = 0;
          local_5b8.data._M_elems[4] = 0;
          local_5b8.data._M_elems[5] = 0;
          local_5b8.data._M_elems[6] = 0;
          local_5b8.data._M_elems[7] = 0;
          local_5b8.data._M_elems[8] = 0;
          local_5b8.data._M_elems[9] = 0;
          local_5b8.data._M_elems[10] = 0;
          local_5b8.data._M_elems[0xb] = 0;
          local_5b8.data._M_elems[0xc] = 0;
          local_5b8.data._M_elems[0xd] = 0;
          local_5b8.data._M_elems[0xe] = 0;
          local_5b8.data._M_elems[0xf] = 0;
          local_5b8.data._M_elems[0x10] = 0;
          local_5b8.data._M_elems[0x11] = 0;
          local_5b8.data._M_elems[0x12] = 0;
          local_5b8.data._M_elems[0x13] = 0;
          local_5b8.data._M_elems[0x14] = 0;
          local_5b8.data._M_elems[0x15] = 0;
          local_5b8.data._M_elems[0x16] = 0;
          local_5b8.data._M_elems[0x17] = 0;
          local_5b8.data._M_elems[0x18] = 0;
          local_5b8.data._M_elems[0x19] = 0;
          local_5b8.data._M_elems._104_5_ = 0;
          local_5b8.data._M_elems[0x1b]._1_3_ = 0;
          local_5b8.exp = 0;
          local_5b8.neg = false;
          local_640._0_4_ = cpp_dec_float_finite;
          local_640._4_4_ = 0x1c;
          local_6b8.info = 0;
          local_6b8.idx = 0;
          auStack_6b0[0] = 0;
          auStack_6b0[1] = 0;
          auStack_6b0[2] = 0;
          auStack_6b0[3] = 0;
          auStack_6b0[4] = 0;
          auStack_6b0[5] = 0;
          auStack_6b0[6] = 0;
          auStack_6b0[7] = 0;
          auStack_6b0[8] = 0;
          auStack_6b0[9] = 0;
          auStack_6b0[10] = 0;
          auStack_6b0[0xb] = 0;
          auStack_6b0[0xc] = 0;
          auStack_6b0[0xd] = 0;
          auStack_6b0[0xe] = 0;
          auStack_6b0[0xf] = 0;
          auStack_6b0[0x10] = 0;
          auStack_6b0[0x11] = 0;
          auStack_6b0[0x12] = 0;
          auStack_6b0[0x13] = 0;
          auStack_6b0[0x14] = 0;
          auStack_6b0[0x15] = 0;
          auStack_6b0[0x16] = 0;
          auStack_6b0[0x17] = 0;
          stack0xfffffffffffff9b0 = 0;
          uStack_64b = 0;
          iStack_648 = 0;
          bStack_644 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6b8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10) !=
              &local_5b8) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
            pcVar16 = &local_5b8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
            }
            local_5b8.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
            local_5b8.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
            local_5b8._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_5b8,(cpp_dec_float<200U,_int,_void> *)&local_6b8);
          shiftUPbound(this,iVar19,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_5b8);
        }
        else {
          pnVar2 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar14 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar10);
          pnVar17 = &local_238;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_238.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar10 + -0x10);
          local_238.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar10 + -0xc);
          local_238.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar10 + -8);
          shiftUPbound(this,iVar19,&local_238);
          pVVar9 = this->theUbound;
          pVVar12 = this->theLbound;
LAB_0051a878:
          pnVar2 = (pVVar9->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined4 *)
                   ((long)&(pVVar12->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar10);
          puVar15 = (undefined4 *)((long)&pnVar2[-1].m_backend.data + lVar10);
          puVar18 = puVar1;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar18 = *puVar15;
            puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
          }
          puVar1[0x1c] = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar10 + -0x10);
          *(undefined1 *)(puVar1 + 0x1d) =
               *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar10 + -0xc);
          *(undefined8 *)(puVar1 + 0x1e) =
               *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar10 + -8);
        }
      }
      lVar10 = lVar10 + -0x80;
      bVar7 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar7);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}